

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::clear_ImputedValue(Imputer *this)

{
  switch(this->_oneof_case_[0]) {
  case 3:
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->ImputedValue_).imputedstringvalue_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    if ((this->ImputedValue_).imputeddoublearray_ != (DoubleVector *)0x0) {
      (*(((this->ImputedValue_).imputeddoublearray_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Imputer::clear_ImputedValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ImputedValue_case()) {
    case kImputedDoubleValue: {
      // No need to clear
      break;
    }
    case kImputedInt64Value: {
      // No need to clear
      break;
    }
    case kImputedStringValue: {
      ImputedValue_.imputedstringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kImputedDoubleArray: {
      delete ImputedValue_.imputeddoublearray_;
      break;
    }
    case kImputedInt64Array: {
      delete ImputedValue_.imputedint64array_;
      break;
    }
    case kImputedStringDictionary: {
      delete ImputedValue_.imputedstringdictionary_;
      break;
    }
    case kImputedInt64Dictionary: {
      delete ImputedValue_.imputedint64dictionary_;
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = IMPUTEDVALUE_NOT_SET;
}